

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O1

void __thiscall
directed_flag_complex_in_memory_t<std::pair<int,_float>_>::
for_each_cell<directed_flag_complex_in_memory_computer::compute_filtration_t>
          (directed_flag_complex_in_memory_t<std::pair<int,_float>_> *this,
          vector<directed_flag_complex_in_memory_computer::compute_filtration_t,_std::allocator<directed_flag_complex_in_memory_computer::compute_filtration_t>_>
          *fs,int min_dimension,int max_dimension)

{
  int thread_id;
  long lVar1;
  int number_of_threads;
  int local_7c;
  int local_78;
  int min_dimension_local;
  reference_wrapper<directed_flag_complex_in_memory_computer::compute_filtration_t> local_70;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_> *local_68;
  code *local_60;
  undefined8 local_58;
  thread local_50;
  vector<std::thread,_std::allocator<std::thread>_> t;
  
  if (max_dimension == -1) {
    max_dimension = min_dimension;
  }
  number_of_threads =
       (int)((ulong)((long)(fs->
                           super__Vector_base<directed_flag_complex_in_memory_computer::compute_filtration_t,_std::allocator<directed_flag_complex_in_memory_computer::compute_filtration_t>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(fs->
                          super__Vector_base<directed_flag_complex_in_memory_computer::compute_filtration_t,_std::allocator<directed_flag_complex_in_memory_computer::compute_filtration_t>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 6);
  local_78 = max_dimension;
  min_dimension_local = min_dimension;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (&t,(long)number_of_threads,(allocator_type *)&local_60);
  local_7c = 0;
  if (number_of_threads < 2) {
    thread_id = number_of_threads + -1;
  }
  else {
    do {
      local_60 = worker_thread<directed_flag_complex_in_memory_computer::compute_filtration_t>;
      local_58 = 0;
      local_70._M_data =
           (fs->
           super__Vector_base<directed_flag_complex_in_memory_computer::compute_filtration_t,_std::allocator<directed_flag_complex_in_memory_computer::compute_filtration_t>_>
           )._M_impl.super__Vector_impl_data._M_start + local_7c;
      local_68 = this;
      std::thread::
      thread<void(directed_flag_complex_in_memory_t<std::pair<int,float>>::*)(int,int,directed_flag_complex_in_memory_computer::compute_filtration_t&,int,int),directed_flag_complex_in_memory_t<std::pair<int,float>>*,int&,int&,std::reference_wrapper<directed_flag_complex_in_memory_computer::compute_filtration_t>,int&,int&,void>
                (&local_50,
                 (offset_in_directed_flag_complex_in_memory_t<std::pair<int,_float>_>_to_subr *)
                 &local_60,&local_68,&number_of_threads,&local_7c,&local_70,&min_dimension_local,
                 &local_78);
      if (t.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start[local_7c]._M_id._M_thread != 0) {
        std::terminate();
      }
      t.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start[local_7c]._M_id._M_thread =
           (native_handle_type)local_50._M_id._M_thread;
      local_7c = local_7c + 1;
      thread_id = number_of_threads + -1;
    } while (local_7c < thread_id);
  }
  worker_thread<directed_flag_complex_in_memory_computer::compute_filtration_t>
            (this,number_of_threads,thread_id,
             (fs->
             super__Vector_base<directed_flag_complex_in_memory_computer::compute_filtration_t,_std::allocator<directed_flag_complex_in_memory_computer::compute_filtration_t>_>
             )._M_impl.super__Vector_impl_data._M_start + thread_id,min_dimension_local,local_78);
  if (1 < number_of_threads) {
    lVar1 = 0;
    do {
      std::thread::join();
      lVar1 = lVar1 + 1;
    } while (lVar1 < (long)number_of_threads + -1);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&t);
  return;
}

Assistant:

void for_each_cell(std::vector<Func>& fs, int min_dimension, int max_dimension = -1) {
		if (max_dimension == -1) max_dimension = min_dimension;

		auto number_of_threads = int(fs.size());
		std::vector<std::thread> t(number_of_threads);

		for (auto index = 0; index < number_of_threads - 1; ++index)
			t[index] = std::thread(&directed_flag_complex_in_memory_t<ExtraData>::worker_thread<Func>, this,
			                       number_of_threads, index, std::ref(fs[index]), min_dimension, max_dimension);

		// Also do work in this thread, namely the last bit
		worker_thread(number_of_threads, number_of_threads - 1, fs[number_of_threads - 1], min_dimension,
		              max_dimension);

		// Wait until all threads stopped
		for (auto i = 0; i < number_of_threads - 1; ++i) t[i].join();
	}